

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSchema
          (MessageGenerator *this,Printer *printer,int offset,int has_offset)

{
  int iVar1;
  bool bVar2;
  LogMessage *pLVar3;
  size_type sVar4;
  int local_f8;
  LogFinisher local_e2;
  byte local_e1;
  LogMessage local_e0;
  LogFinisher local_a2;
  byte local_a1;
  LogMessage local_a0;
  int local_68 [2];
  int inlined_string_indices_offset;
  undefined1 local_58 [8];
  Formatter format;
  int has_offset_local;
  int offset_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = has_offset;
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = offset;
  Formatter::Formatter((Formatter *)local_58,printer,&this->variables_);
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
  if ((!bVar2) || (bVar2 = IsMapEntryMessage(this->descriptor_), bVar2)) {
    local_f8 = format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ +
               (int)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  else {
    local_f8 = -1;
  }
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = local_f8;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(&this->inlined_string_indices_);
  if (bVar2) {
    local_68[0] = -1;
  }
  else {
    local_a1 = 0;
    if ((int)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count == -1) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x821);
      local_a1 = 1;
      pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (has_offset) != (-1): ");
      internal::LogFinisher::operator=(&local_a2,pLVar3);
    }
    if ((local_a1 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_a0);
    }
    local_e1 = 0;
    bVar2 = IsMapEntryMessage(this->descriptor_);
    if (bVar2) {
      internal::LogMessage::LogMessage
                (&local_e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                 ,0x822);
      local_e1 = 1;
      pLVar3 = internal::LogMessage::operator<<
                         (&local_e0,"CHECK failed: !IsMapEntryMessage(descriptor_): ");
      internal::LogFinisher::operator=(&local_e2,pLVar3);
    }
    if ((local_e1 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_e0);
    }
    iVar1 = (int)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count;
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&this->has_bit_indices_);
    local_68[0] = iVar1 + (int)sVar4;
  }
  Formatter::operator()
            ((Formatter *)local_58,"{ $1$, $2$, $3$, sizeof($classtype$)},\n",
             (int *)((long)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
             (int *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,local_68);
  Formatter::~Formatter((Formatter *)local_58);
  return;
}

Assistant:

void MessageGenerator::GenerateSchema(io::Printer* printer, int offset,
                                      int has_offset) {
  Formatter format(printer, variables_);
  has_offset = !has_bit_indices_.empty() || IsMapEntryMessage(descriptor_)
                   ? offset + has_offset
                   : -1;
  int inlined_string_indices_offset;
  if (inlined_string_indices_.empty()) {
    inlined_string_indices_offset = -1;
  } else {
    GOOGLE_DCHECK_NE(has_offset, -1);
    GOOGLE_DCHECK(!IsMapEntryMessage(descriptor_));
    inlined_string_indices_offset = has_offset + has_bit_indices_.size();
  }

  format("{ $1$, $2$, $3$, sizeof($classtype$)},\n", offset, has_offset,
         inlined_string_indices_offset);
}